

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_buffer_method___tostring(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  
  TVar1 = recff_sbufx_check(J,rd,0);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090013;
  TVar2 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x4509000e;
  TVar1 = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x2a15;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar1 = lj_opt_fold(J);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b131275;
  TVar1 = lj_opt_fold(J);
  (J->fold).ins.field_0.ot = 0x5004;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
  TVar1 = lj_opt_fold(J);
  *J->base = TVar1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_buffer_method___tostring(jit_State *J, RecordFFData *rd)
{
  TRef ud = recff_sbufx_check(J, rd, 0);
  TRef trr = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_R);
  TRef trw = recff_sbufx_get_ptr(J, ud, IRFL_SBUF_W);
  J->base[0] = emitir(IRT(IR_XSNEW, IRT_STR), trr, recff_sbufx_len(J, trr, trw));
}